

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall
t_ocaml_generator::generate_ocaml_struct_sig
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  pointer pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  undefined7 in_register_00000009;
  pointer pptVar7;
  string mname;
  string tname;
  string type;
  string x;
  char *local_120;
  char local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  t_struct *local_100;
  undefined4 local_f4;
  string local_f0;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  string local_b0;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  local_100 = tstruct;
  type_name_abi_cxx11_(&local_f0,this,&tstruct->super_t_type);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"class ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," :",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"object (\'a)",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_x","");
  t_generator::tmp(&local_50,(t_generator *)this,&local_70);
  local_f4 = (undefined4)CONCAT71(in_register_00000009,is_exception);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pptVar7 = (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish != pptVar7) &&
     (pptVar7 !=
      (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    do {
      pcVar2 = ((*pptVar7)->name_)._M_dataplus._M_p;
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + ((*pptVar7)->name_)._M_string_length);
      pcVar3 = local_90;
      iVar5 = tolower((int)*local_90);
      *pcVar3 = (char)iVar5;
      lVar4 = local_88;
      local_120 = &local_110;
      if (local_90 == &local_80) {
        uStack_108 = uStack_78;
      }
      else {
        local_120 = local_90;
      }
      _local_110 = CONCAT71(uStack_7f,local_80);
      local_88 = 0;
      local_80 = '\0';
      local_90 = &local_80;
      render_ocaml_type_abi_cxx11_(&local_b0,this,(*pptVar7)->type_);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method get_",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," option",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method grab_",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method set_",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> unit",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((*pptVar7)->value_ == (t_const_value *)0x0) {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method unset_",0xd);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," : unit",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method reset_",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," : unit",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_100->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method copy : \'a",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"method write : Protocol.t -> unit",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((char)local_f4 != '\0') {
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"exception ",10);
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    pcVar3 = local_d0;
    iVar5 = toupper((int)*local_d0);
    *pcVar3 = (char)iVar5;
    lVar4 = local_c8;
    if (local_d0 == &local_c0) {
      uStack_108 = uStack_b8;
      local_120 = &local_110;
    }
    else {
      local_120 = local_d0;
    }
    _local_110 = CONCAT71(uStack_bf,local_c0);
    local_c8 = 0;
    local_c0 = '\0';
    local_d0 = &local_c0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_120,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," of ",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_120 != &local_110) {
      operator_delete(local_120);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"val read_",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," : Protocol.t -> ",0x11);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_sig(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " :" << endl;
  indent(out) << "object ('a)" << endl;

  indent_up();

  string x = tmp("_x");
  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      string mname = decapitalize((*m_iter)->get_name());
      string type = render_ocaml_type((*m_iter)->get_type());
      indent(out) << "method get_" << mname << " : " << type << " option" << endl;
      indent(out) << "method grab_" << mname << " : " << type << endl;
      indent(out) << "method set_" << mname << " : " << type << " -> unit" << endl;
      if (!struct_member_persistent(*m_iter))
        indent(out) << "method unset_" << mname << " : unit" << endl;
      indent(out) << "method reset_" << mname << " : unit" << endl;
    }
  }
  indent(out) << "method copy : 'a" << endl;
  indent(out) << "method write : Protocol.t -> unit" << endl;
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  indent(out) << "val read_" << tname << " : Protocol.t -> " << tname << endl;
}